

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnRethrowExpr
          (BinaryReaderInterp *this,Index depth)

{
  Index index;
  bool bVar1;
  Result result;
  Location local_b0;
  Var local_90;
  Location local_48;
  Enum local_24;
  Index local_20;
  Index local_1c;
  Index catch_depth;
  Index depth_local;
  BinaryReaderInterp *this_local;
  
  local_1c = depth;
  _catch_depth = this;
  GetLocation(&local_48,this);
  index = local_1c;
  GetLocation(&local_b0,this);
  Var::Var(&local_90,index,&local_b0);
  local_24 = (Enum)SharedValidator::OnRethrow(&this->validator_,&local_48,&local_90);
  bVar1 = Failed((Result)local_24);
  Var::~Var(&local_90);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    result = SharedValidator::GetCatchCount(&this->validator_,local_1c,&local_20);
    bVar1 = Failed(result);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Istream::Emit(this->istream_,Rethrow,local_20 - 1);
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnRethrowExpr(Index depth) {
  Index catch_depth;
  CHECK_RESULT(validator_.OnRethrow(GetLocation(), Var(depth, GetLocation())));
  CHECK_RESULT(validator_.GetCatchCount(depth, &catch_depth));
  // The rethrow opcode takes an index into the exception stack rather than
  // the number of catch nestings, so we subtract one here.
  istream_.Emit(Opcode::Rethrow, catch_depth - 1);
  return Result::Ok;
}